

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

GlobalFederateId __thiscall helics::TimeDependencies::getMinDependency(TimeDependencies *this)

{
  bool bVar1;
  reference this_00;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  *in_RDI;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range1;
  Time minTime;
  GlobalFederateId minID;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffffb8
  ;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_28 [2];
  TimeRepresentation<count_time<9,_long>_> local_18 [2];
  GlobalFederateId local_4;
  
  GlobalFederateId::GlobalFederateId(&local_4);
  local_18[0].internalTimeCode = 0x7fffffffffffffff;
  local_28[0]._M_current =
       (DependencyInfo *)
       std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
            (in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           (in_RDI,(__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                    *)in_stack_ffffffffffffffb8), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
              ::operator*(local_28);
    if (((((this_00->dependency & 1U) != 0) &&
         (bVar1 = GlobalFederateId::isFederate(&this_00->fedID), bVar1)) &&
        (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                           ((TimeRepresentation<count_time<9,_long>_> *)this_00,
                            (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)) &&
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)this_00,local_18), bVar1)) {
      local_18[0].internalTimeCode = (this_00->super_TimeData).next.internalTimeCode;
      local_4.gid = (this_00->fedID).gid;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(local_28);
  }
  return (GlobalFederateId)local_4.gid;
}

Assistant:

GlobalFederateId TimeDependencies::getMinDependency() const
{
    GlobalFederateId minID;
    Time minTime(Time::maxVal());
    for (const auto& dep : dependencies) {
        if (dep.dependency && (dep.fedID.isFederate()) && (dep.next < cBigTime)) {
            if (dep.next < minTime) {
                minTime = dep.next;
                minID = dep.fedID;
            }
        }
    }
    return minID;
}